

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::saveOutput(FastText *this)

{
  element_type *peVar1;
  pointer pcVar2;
  Dictionary *pDVar3;
  char cVar4;
  uint uVar5;
  ostream *poVar6;
  long *plVar7;
  invalid_argument *piVar8;
  size_type *psVar9;
  ulong i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Vector vec;
  ofstream ofs;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  pcVar2 = (peVar1->output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar2,pcVar2 + (peVar1->output)._M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  std::ofstream::ofstream(&local_230,(string *)&local_270,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    if (this->quant_ != true) {
      pDVar3 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          model == sup) {
        uVar5 = Dictionary::nlabels(pDVar3);
      }
      else {
        uVar5 = Dictionary::nwords(pDVar3);
      }
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      plVar7 = (long *)std::ostream::operator<<
                                 ((ostream *)poVar6,
                                  ((this->args_).
                                   super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->dim);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      Vector::Vector((Vector *)&local_250,
                     (long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           dim);
      if (0 < (int)uVar5) {
        i = 0;
        do {
          pDVar3 = (this->dict_).
                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->model == sup) {
            Dictionary::getLabel_abi_cxx11_(&local_270,pDVar3,(int32_t)i);
          }
          else {
            Dictionary::getWord_abi_cxx11_(&local_270,pDVar3,(int32_t)i);
          }
          Vector::zero((Vector *)&local_250);
          Vector::addRow((Vector *)&local_250,
                         (this->output_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,local_270._M_dataplus._M_p,
                              local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          poVar6 = operator<<(poVar6,(Vector *)&local_250);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p);
          }
          i = i + 1;
        } while (uVar5 != i);
      }
      std::ofstream::close();
      if (local_250._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      return;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar8,"Option -saveOutput is not supported for quantized models.");
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->output,".output");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_270._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_270._M_dataplus._M_p == psVar9) {
    local_270.field_2._M_allocated_capacity = *psVar9;
    local_270.field_2._8_8_ = plVar7[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar9;
  }
  local_270._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::invalid_argument::invalid_argument(piVar8,(string *)&local_270);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveOutput() {
  std::ofstream ofs(args_->output + ".output");
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        args_->output + ".output" + " cannot be opened for saving vectors!");
  }
  if (quant_) {
    throw std::invalid_argument(
        "Option -saveOutput is not supported for quantized models.");
  }
  int32_t n = (args_->model == model_name::sup) ? dict_->nlabels()
                                                : dict_->nwords();
  ofs << n << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < n; i++) {
    std::string word = (args_->model == model_name::sup) ? dict_->getLabel(i)
                                                         : dict_->getWord(i);
    vec.zero();
    vec.addRow(*output_, i);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}